

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void mpark::throw_bad_variant_access(void)

{
  void *__s;
  bad_variant_access *unaff_retaddr;
  
  __s = (void *)__cxa_allocate_exception(8);
  memset(__s,0,8);
  bad_variant_access::bad_variant_access(unaff_retaddr);
  __cxa_throw(__s,&bad_variant_access::typeinfo,bad_variant_access::~bad_variant_access);
}

Assistant:

[[noreturn]] inline void throw_bad_variant_access() {
#ifdef MPARK_EXCEPTIONS
    throw bad_variant_access{};
#else
    std::terminate();
#ifdef MPARK_BUILTIN_UNREACHABLE
    __builtin_unreachable();
#endif
#endif
  }